

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merl.cpp
# Opt level: O2

bool loadViewerProgram(void)

{
  bool bVar1;
  GLenum GVar2;
  djg_program *program;
  char buf [1024];
  
  program = djgp_create();
  fwrite("Loading {Framebuffer-Blit-Program}\n",0x23,1,_stdout);
  fflush(_stdout);
  if (g_framebuffer.aa - 1U < 4) {
    djgp_push_string(program,"#define MSAA_FACTOR %i\n",
                     (ulong)(uint)(1 << ((byte)g_framebuffer.aa & 0x1f)));
  }
  strcat2(buf,g_app.dir.shader,"viewer.glsl");
  djgp_push_file(program,buf);
  bVar1 = djgp_to_gl(program,0x1ae,false,true,g_gl.programs);
  if (bVar1) {
    djgp_release(program);
    g_gl.uniforms[0] = (*glad_glGetUniformLocation)(g_gl.programs[0],"u_FramebufferSampler");
    g_gl.uniforms[3] = (*glad_glGetUniformLocation)(g_gl.programs[0],"u_Viewport");
    g_gl.uniforms[1] = (*glad_glGetUniformLocation)(g_gl.programs[0],"u_Exposure");
    g_gl.uniforms[2] = (*glad_glGetUniformLocation)(g_gl.programs[0],"u_Gamma");
    configureViewerProgram();
    GVar2 = (*glad_glGetError)();
    bVar1 = GVar2 == 0;
  }
  else {
    fwrite("=> Failure <=\n",0xe,1,_stdout);
    fflush(_stdout);
    djgp_release(program);
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool loadViewerProgram()
{
    djg_program *djp = djgp_create();
    GLuint *program = &g_gl.programs[PROGRAM_VIEWER];
    char buf[1024];

    LOG("Loading {Framebuffer-Blit-Program}\n");
    if (g_framebuffer.aa >= AA_MSAA2 && g_framebuffer.aa <= AA_MSAA16)
        djgp_push_string(djp, "#define MSAA_FACTOR %i\n", 1 << g_framebuffer.aa);
    djgp_push_file(djp, strcat2(buf, g_app.dir.shader, "viewer.glsl"));
    if (!djgp_to_gl(djp, 430, false, true, program)) {
        LOG("=> Failure <=\n");
        djgp_release(djp);

        return false;
    }
    djgp_release(djp);

    g_gl.uniforms[UNIFORM_VIEWER_FRAMEBUFFER_SAMPLER] =
        glGetUniformLocation(g_gl.programs[PROGRAM_VIEWER], "u_FramebufferSampler");
    g_gl.uniforms[UNIFORM_VIEWER_VIEWPORT] =
        glGetUniformLocation(g_gl.programs[PROGRAM_VIEWER], "u_Viewport");
    g_gl.uniforms[UNIFORM_VIEWER_EXPOSURE] =
        glGetUniformLocation(g_gl.programs[PROGRAM_VIEWER], "u_Exposure");
    g_gl.uniforms[UNIFORM_VIEWER_GAMMA] =
        glGetUniformLocation(g_gl.programs[PROGRAM_VIEWER], "u_Gamma");

    configureViewerProgram();

    return (glGetError() == GL_NO_ERROR);
}